

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::parseCommaSepArgs
               (int argc,char **argv,char *pattern,
               vector<doctest::String,_std::allocator<doctest::String>_> *res)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  size_t sVar4;
  char *pcVar5;
  String *in_RDX;
  char **in_RSI;
  undefined4 in_EDI;
  char character;
  char *end;
  char *current;
  bool seenBackslash;
  anon_class_16_2_fa5d9a36 flush;
  ostringstream s;
  String filtersString;
  String *in_stack_fffffffffffffdd8;
  char *pcVar6;
  undefined4 in_stack_fffffffffffffde0;
  char *local_1f8;
  ostringstream local_1d8 [56];
  anon_class_16_2_fa5d9a36 *in_stack_fffffffffffffe60;
  bool local_1;
  
  String::String((String *)0x765673);
  String::String((String *)0x7656a5);
  bVar3 = parseOption((int)in_RDX,in_RSI,(char *)CONCAT44(in_EDI,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8,(String *)0x7656ca);
  String::~String(in_RDX);
  if ((bVar3 & 1) == 0) {
    local_1 = false;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    bVar2 = false;
    local_1f8 = String::c_str(in_stack_fffffffffffffdd8);
    pcVar6 = local_1f8;
    sVar4 = strlen(local_1f8);
    while (local_1f8 != pcVar6 + sVar4) {
      pcVar5 = local_1f8 + 1;
      cVar1 = *local_1f8;
      local_1f8 = pcVar5;
      if (bVar2) {
        bVar2 = false;
        if (cVar1 != ',') {
          std::ostream::put((char)local_1d8);
          goto LAB_0076580f;
        }
        std::ostream::put((char)local_1d8);
      }
      else {
LAB_0076580f:
        if (cVar1 == '\\') {
          bVar2 = true;
        }
        else if (cVar1 == ',') {
          parseCommaSepArgs::anon_class_16_2_fa5d9a36::operator()(in_stack_fffffffffffffe60);
        }
        else {
          std::ostream::put((char)local_1d8);
        }
      }
    }
    if (bVar2) {
      std::ostream::put((char)local_1d8);
    }
    parseCommaSepArgs::anon_class_16_2_fa5d9a36::operator()(in_stack_fffffffffffffe60);
    local_1 = true;
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  String::~String(in_RDX);
  return local_1;
}

Assistant:

bool parseCommaSepArgs(int argc, const char* const* argv, const char* pattern,
                           std::vector<String>& res) {
        String filtersString;
        if(parseOption(argc, argv, pattern, &filtersString)) {
            // tokenize with "," as a separator, unless escaped with backslash
            std::ostringstream s;
            auto flush = [&s, &res]() {
                auto string = s.str();
                if(string.size() > 0) {
                    res.push_back(string.c_str());
                }
                s.str("");
            };

            bool seenBackslash = false;
            const char* current = filtersString.c_str();
            const char* end = current + strlen(current);
            while(current != end) {
                char character = *current++;
                if(seenBackslash) {
                    seenBackslash = false;
                    if(character == ',') {
                        s.put(',');
                        continue;
                    }
                    s.put('\\');
                }
                if(character == '\\') {
                    seenBackslash = true;
                } else if(character == ',') {
                    flush();
                } else {
                    s.put(character);
                }
            }

            if(seenBackslash) {
                s.put('\\');
            }
            flush();
            return true;
        }
        return false;
    }